

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashdyn.c
# Opt level: O0

void * tommy_hashdyn_remove(tommy_hashdyn *hashdyn,undefined1 *cmp,void *cmp_arg,tommy_hash_t hash)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long in_FS_OFFSET;
  tommy_node *local_40;
  tommy_hashdyn_node *node;
  tommy_count_t pos;
  tommy_hash_t hash_local;
  void *cmp_arg_local;
  undefined1 *cmp_local;
  tommy_hashdyn *hashdyn_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = hash & hashdyn->bucket_mask;
  local_40 = hashdyn->bucket[uVar2];
  do {
    if (local_40 == (tommy_node *)0x0) {
      hashdyn_local = (tommy_hashdyn *)0x0;
LAB_0010a150:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return hashdyn_local;
      }
      __stack_chk_fail();
    }
    if (local_40->key == hash) {
      iVar3 = (*(code *)cmp)(cmp_arg,local_40->data);
      if (iVar3 == 0) {
        tommy_list_remove_existing(hashdyn->bucket + uVar2,local_40);
        hashdyn->count = hashdyn->count - 1;
        hashdyn_shrink_step(hashdyn);
        hashdyn_local = (tommy_hashdyn *)local_40->data;
        goto LAB_0010a150;
      }
    }
    local_40 = local_40->next;
  } while( true );
}

Assistant:

void* tommy_hashdyn_remove(tommy_hashdyn* hashdyn, tommy_search_func* cmp, const void* cmp_arg, tommy_hash_t hash)
{
	tommy_count_t pos = hash & hashdyn->bucket_mask;
	tommy_hashdyn_node* node = hashdyn->bucket[pos];

	while (node) {
		/* we first check if the hash matches, as in the same bucket we may have multiples hash values */
		if (node->key == hash && cmp(cmp_arg, node->data) == 0) {
			tommy_list_remove_existing(&hashdyn->bucket[pos], node);

			--hashdyn->count;

			hashdyn_shrink_step(hashdyn);

			return node->data;
		}
		node = node->next;
	}

	return 0;
}